

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_io_block(CompilerHLSL *this,SPIRVariable *var)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t id;
  size_t sVar4;
  TypedID *this_00;
  Bitset *pBVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  undefined1 local_188 [68];
  uint32_t local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  SPIRType *local_120;
  SPIRType *membertype;
  spirv_cross local_f8 [36];
  ExecutionModel local_d4;
  undefined1 local_d0 [4];
  uint32_t location_1;
  spirv_cross local_b0 [36];
  uint32_t local_8c;
  ExecutionModel local_88;
  uint32_t local_84;
  uint32_t location;
  string semantic;
  uint local_60;
  uint32_t i;
  uint32_t base_location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  SPIRType *local_28;
  SPIRType *type;
  SPIREntryPoint *execution;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  execution = (SPIREntryPoint *)var;
  var_local = (SPIRVariable *)this;
  type = (SPIRType *)Compiler::get_entry_point((Compiler *)this);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&execution->field_0xc);
  local_28 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_28->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_28->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_48,this,(ulong)uVar3,1);
  CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string>
            (&this->super_CompilerGLSL,(char (*) [8])"struct ",local_48);
  ::std::__cxx11::string::~string((string *)local_48);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_28->member_name_cache);
  uVar3 = Compiler::get_decoration
                    ((Compiler *)this,(ID)*(uint32_t *)&execution->name,DecorationLocation);
  local_60 = 0;
  while( true ) {
    sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      (&(local_28->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    if ((uint)sVar4 <= local_60) break;
    ::std::__cxx11::string::string((string *)&location);
    local_84 = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(local_28->super_IVariant).self);
    bVar2 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)local_84,local_60,DecorationLocation);
    if (bVar2) {
      local_8c = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(local_28->super_IVariant).self);
      local_88 = Compiler::get_member_decoration
                           ((Compiler *)this,(TypeID)local_8c,local_60,DecorationLocation);
      to_semantic_abi_cxx11_
                ((CompilerHLSL *)local_d0,(uint32_t)this,local_88,
                 *(StorageClass *)(type->member_type_index_redirection).stack_storage.aligned_char);
      join<char_const(&)[4],std::__cxx11::string>
                (local_b0,(char (*) [4])0x4e5f4b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      ::std::__cxx11::string::operator=((string *)&location,(string *)local_b0);
      ::std::__cxx11::string::~string((string *)local_b0);
      ::std::__cxx11::string::~string((string *)local_d0);
    }
    else {
      local_d4 = uVar3 + local_60;
      to_semantic_abi_cxx11_
                ((CompilerHLSL *)&membertype,(uint32_t)this,local_d4,
                 *(StorageClass *)(type->member_type_index_redirection).stack_storage.aligned_char);
      join<char_const(&)[4],std::__cxx11::string>
                (local_f8,(char (*) [4])0x4e5f4b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&membertype);
      ::std::__cxx11::string::operator=((string *)&location,(string *)local_f8);
      ::std::__cxx11::string::~string((string *)local_f8);
      ::std::__cxx11::string::~string((string *)&membertype);
    }
    CompilerGLSL::add_member_name(&this->super_CompilerGLSL,local_28,local_60);
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(local_28->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)local_60);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    local_120 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
    local_144 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(local_28->super_IVariant).self);
    pBVar5 = Compiler::get_member_decoration_bitset((Compiler *)this,(TypeID)local_144,local_60);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(local_140,this,pBVar5);
    pSVar1 = local_120;
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_188,(SPIRType *)this,(uint32_t)local_28);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
              (local_188 + 0x20,this,pSVar1,local_188,0);
    CompilerGLSL::
    statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_188 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location,
               (char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)(local_188 + 0x20));
    ::std::__cxx11::string::~string((string *)local_188);
    ::std::__cxx11::string::~string((string *)local_140);
    ::std::__cxx11::string::~string((string *)&location);
    local_60 = local_60 + 1;
  }
  CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x24])(local_1a8,this,execution);
  CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char (*) [8])"static ",local_1a8,(char (*) [2])0x4d9ce2);
  ::std::__cxx11::string::~string((string *)local_1a8);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
  return;
}

Assistant:

void CompilerHLSL::emit_io_block(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	auto &type = get<SPIRType>(var.basetype);
	add_resource_name(type.self);

	statement("struct ", to_name(type.self));
	begin_scope();
	type.member_name_cache.clear();

	uint32_t base_location = get_decoration(var.self, DecorationLocation);

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		string semantic;
		if (has_member_decoration(type.self, i, DecorationLocation))
		{
			uint32_t location = get_member_decoration(type.self, i, DecorationLocation);
			semantic = join(" : ", to_semantic(location, execution.model, var.storage));
		}
		else
		{
			// If the block itself has a location, but not its members, use the implicit location.
			// There could be a conflict if the block members partially specialize the locations.
			// It is unclear how SPIR-V deals with this. Assume this does not happen for now.
			uint32_t location = base_location + i;
			semantic = join(" : ", to_semantic(location, execution.model, var.storage));
		}

		add_member_name(type, i);

		auto &membertype = get<SPIRType>(type.member_types[i]);
		statement(to_interpolation_qualifiers(get_member_decoration_bitset(type.self, i)),
		          variable_decl(membertype, to_member_name(type, i)), semantic, ";");
	}

	end_scope_decl();
	statement("");

	statement("static ", variable_decl(var), ";");
	statement("");
}